

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

wostream * Centaurus::operator<<(wostream *os,PriorityChainElement *e)

{
  wostream *pwVar1;
  
  pwVar1 = std::operator<<(os,(wstring *)&(e->m_id).m_id);
  pwVar1 = std::operator<<(pwVar1,L':');
  pwVar1 = (wostream *)std::wostream::operator<<((wostream *)pwVar1,e->m_index);
  pwVar1 = std::operator<<(pwVar1,L'=');
  std::wostream::operator<<((wostream *)pwVar1,e->m_priority);
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const PriorityChainElement& e)
{
    os << e.id() << L':' << e.index() << L'=' << e.priority();
    return os;
}